

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layer.cpp
# Opt level: O3

int __thiscall ncnn::Layer_final::load_param(Layer_final *this,ParamDict *pd)

{
  Layer *pLVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  
  set_layer_properties(this);
  iVar5 = (*this->layer_cpu->_vptr_Layer[2])(this->layer_cpu,pd);
  pLVar1 = this->layer_cpu;
  (this->super_Layer).one_blob_only = pLVar1->one_blob_only;
  (this->super_Layer).support_inplace = pLVar1->support_inplace;
  bVar2 = pLVar1->support_bf16_storage;
  bVar3 = pLVar1->support_fp16_storage;
  bVar4 = pLVar1->support_int8_storage;
  (this->super_Layer).support_packing = pLVar1->support_packing;
  (this->super_Layer).support_bf16_storage = bVar2;
  (this->super_Layer).support_fp16_storage = bVar3;
  (this->super_Layer).support_int8_storage = bVar4;
  (this->super_Layer).support_vulkan = false;
  (this->super_Layer).support_image_storage = false;
  (this->super_Layer).support_tensor_storage = false;
  return iVar5;
}

Assistant:

virtual int load_param(const ParamDict& pd)
    {
        set_layer_properties();
#if NCNN_VULKAN
        if (layer_vulkan)
        {
            if (vkdev)
            {
                int ret = layer_vulkan->load_param(pd);
                get_layer_properties();

                if (layer_vulkan->support_vulkan)
                    return ret;
            }

            // fallback to cpu layer
            delete layer_vulkan;
            layer_vulkan = 0;
        }
#endif // NCNN_VULKAN

        int ret = layer_cpu->load_param(pd);
        get_layer_properties();
        return ret;
    }